

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O1

int CfdGetBlockHeaderData
              (void *handle,void *block_handle,uint32_t *version,char **prev_block_hash,
              char **merkle_root_hash,uint32_t *time,uint32_t *bits,uint32_t *nonce)

{
  CfdException *pCVar1;
  char *work_prev_block_hash;
  BlockHeader header;
  char *local_f8;
  char *local_f0;
  undefined1 local_e8 [40];
  BlockHash local_c0;
  uint32_t local_a0;
  uint32_t uStack_9c;
  uint32_t local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  BlockHash local_68;
  undefined8 local_48;
  uint32_t local_40;
  uint32_t *local_38;
  
  local_f0 = (char *)0x0;
  local_f8 = (char *)0x0;
  local_38 = time;
  cfd::Initialize();
  local_90._0_8_ = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"BlockOpe","");
  cfd::capi::CheckBuffer(block_handle,(string *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._0_8_ != &local_80) {
    operator_delete((void *)local_90._0_8_);
  }
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  local_90._8_8_ = &PTR__BlockHash_00735740;
  cfd::core::ByteData::ByteData((ByteData *)&local_80);
  local_68._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00735740;
  cfd::core::ByteData::ByteData(&local_68.data_);
  local_48 = 0;
  local_40 = 0;
  if (*(Block **)((long)block_handle + 0x18) != (Block *)0x0) {
    if (*(int *)((long)block_handle + 0x10) < 3) {
      cfd::core::Block::GetBlockHeader
                ((BlockHeader *)local_e8,*(Block **)((long)block_handle + 0x18));
      local_90._0_4_ = local_e8._0_4_;
      cfd::core::BlockHash::operator=((BlockHash *)(local_90 + 8),(BlockHash *)(local_e8 + 8));
      cfd::core::BlockHash::operator=(&local_68,&local_c0);
      local_40 = local_98;
      local_48._0_4_ = local_a0;
      local_48._4_4_ = uStack_9c;
      local_c0._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00735740;
      if (local_c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_e8._8_8_ = &PTR__BlockHash_00735740;
      if ((pointer)local_e8._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8._16_8_);
      }
      if (prev_block_hash != (char **)0x0) {
        cfd::core::BlockHash::GetHex_abi_cxx11_((string *)local_e8,(BlockHash *)(local_90 + 8));
        local_f0 = cfd::capi::CreateString((string *)local_e8);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_);
        }
      }
      if (merkle_root_hash != (char **)0x0) {
        cfd::core::BlockHash::GetHex_abi_cxx11_((string *)local_e8,&local_68);
        local_f8 = cfd::capi::CreateString((string *)local_e8);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_);
        }
      }
      if (version != (uint32_t *)0x0) {
        *version = local_90._0_4_;
      }
      if (prev_block_hash != (char **)0x0) {
        *prev_block_hash = local_f0;
      }
      if (merkle_root_hash != (char **)0x0) {
        *merkle_root_hash = local_f8;
      }
      if (local_38 != (uint32_t *)0x0) {
        *local_38 = (uint32_t)local_48;
      }
      if (bits != (uint32_t *)0x0) {
        *bits = local_48._4_4_;
      }
      if (nonce != (uint32_t *)0x0) {
        *nonce = local_40;
      }
      local_68._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00735740;
      if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_90._8_8_ = &PTR__BlockHash_00735740;
      if ((void *)local_80._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_80._M_allocated_capacity);
      }
      return 0;
    }
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Elements is not supported.","");
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,"Invalid handle state. block is null","");
  cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_e8);
  __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetBlockHeaderData(
    void* handle, void* block_handle, uint32_t* version,
    char** prev_block_hash, char** merkle_root_hash, uint32_t* time,
    uint32_t* bits, uint32_t* nonce) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_prev_block_hash = nullptr;
  char* work_merkle_root_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);

    BlockHeader header;
    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      header = block_data->block->GetBlockHeader();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (prev_block_hash != nullptr) {
      work_prev_block_hash = CreateString(header.prev_block_hash.GetHex());
    }
    if (merkle_root_hash != nullptr) {
      work_merkle_root_hash = CreateString(header.merkle_root_hash.GetHex());
    }

    if (version != nullptr) *version = header.version;
    if (prev_block_hash != nullptr) {
      *prev_block_hash = work_prev_block_hash;
    }
    if (merkle_root_hash != nullptr) {
      *merkle_root_hash = work_merkle_root_hash;
    }
    if (time != nullptr) *time = header.time;
    if (bits != nullptr) *bits = header.bits;
    if (nonce != nullptr) *nonce = header.nonce;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_prev_block_hash, &work_merkle_root_hash);
  return result;
}